

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest_main.h
# Opt level: O1

void __thiscall bssl::TestEventListener::OnTestEnd(TestEventListener *this,TestInfo *test_info)

{
  bool bVar1;
  
  bVar1 = testing::TestResult::Failed(&test_info->result_);
  if (bVar1) {
    ERR_print_errors_fp(_stdout);
    return;
  }
  ERR_clear_error();
  return;
}

Assistant:

void OnTestEnd(const testing::TestInfo &test_info) override {
    if (test_info.result()->Failed()) {
      // The test failed. Print any errors left in the error queue.
      ERR_print_errors_fp(stdout);
    } else {
      // The test succeeded, so any failed operations are expected. Clear the
      // error queue without printing.
      ERR_clear_error();
    }

    // Malloc failure testing is quadratic in the number of mallocs. Running
    // multiple tests sequentially thus scales badly. Reset the malloc counter
    // between tests. This way we will test, each test with the first allocation
    // failing, then the second, and so on, until the test with the most
    // allocations runs out.
    OPENSSL_reset_malloc_counter_for_testing();
  }